

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

bool __thiscall
pdqsort_detail::
partial_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,HighsPrimalHeuristics::RENS(std::vector<double,std::allocator<double>>const&)::__2>
          (pdqsort_detail *this,
          __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
          begin,__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                end,anon_class_16_2_405d1b53 comp)

{
  double __x;
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  pair<int,_double> *ppVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  pair<int,_double> *ppVar12;
  long lVar13;
  pair<int,_double> *ppVar14;
  long lVar15;
  pair<int,_double> *ppVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  long local_b0;
  ulong local_a8;
  
  if (((pair<int,_double> *)this != begin._M_current) &&
     ((pair<int,_double> *)(this + 0x10) != begin._M_current)) {
    lVar3 = *(long *)(*(long *)(**(long **)end._M_current + 0x10) + 8);
    lVar10 = (long)comp.getFixVal[0x51e].localdom - (long)comp.getFixVal[0x51e].this;
    uVar11 = lVar10 >> 4 & 0xffffffff;
    lVar6 = uVar11 + 0x42d8680e260ae5b;
    lVar7 = uVar11 + 0xc8497d2a400d9551;
    local_b0 = 0;
    local_a8 = 0;
    ppVar8 = (pair<int,_double> *)(this + 0x10);
    ppVar16 = (pair<int,_double> *)this;
    do {
      ppVar14 = ppVar8;
      iVar1 = ppVar16[1].first;
      __x = ppVar16[1].second;
      iVar2 = ppVar16->first;
      dVar23 = ppVar16->second;
      dVar21 = (end._M_current)->second;
      lVar9 = (long)iVar1;
      dVar20 = *(double *)(lVar3 + lVar9 * 8);
      if (dVar20 <= 0.0) {
        dVar22 = __x;
        if (0.0 <= dVar20) {
          dVar22 = __x + 0.5;
        }
        dVar20 = floor(dVar22);
      }
      else {
        dVar20 = ceil(__x);
      }
      lVar13 = *(long *)((long)dVar21 + 0x308);
      lVar4 = *(long *)((long)dVar21 + 800);
      dVar21 = *(double *)(lVar4 + lVar9 * 8);
      if (dVar21 <= dVar20) {
        dVar20 = dVar21;
      }
      dVar21 = *(double *)(lVar13 + lVar9 * 8);
      if (dVar20 <= dVar21) {
        dVar20 = dVar21;
      }
      lVar17 = (long)iVar2;
      dVar21 = *(double *)(lVar3 + lVar17 * 8);
      if (dVar21 <= 0.0) {
        dVar22 = dVar23;
        if (0.0 <= dVar21) {
          dVar22 = dVar23 + 0.5;
        }
        dVar21 = floor(dVar22);
      }
      else {
        dVar21 = ceil(dVar23);
      }
      iVar5 = (int)(lVar10 >> 0x24);
      uVar11 = ((ulong)(uint)(iVar5 + iVar1) + 0x80c8963be3e4c2f3) * lVar7 >> 0x20 ^
               ((ulong)(uint)(iVar5 + iVar1) + 0x8a183895eeac1536) * lVar6;
      dVar22 = *(double *)(lVar4 + lVar17 * 8);
      if (dVar22 <= dVar21) {
        dVar21 = dVar22;
      }
      dVar22 = *(double *)(lVar13 + lVar17 * 8);
      if (dVar21 <= dVar22) {
        dVar21 = dVar22;
      }
      if ((ABS(dVar20 - __x) < ABS(dVar21 - dVar23)) ||
         ((ABS(dVar20 - __x) <= ABS(dVar21 - dVar23) &&
          (uVar11 < (((ulong)(uint)(iVar5 + iVar2) + 0x8a183895eeac1536) * lVar6 ^
                    ((ulong)(uint)(iVar5 + iVar2) + 0x80c8963be3e4c2f3) * lVar7 >> 0x20))))) {
        ppVar16[1].first = iVar2;
        ppVar14->second = dVar23;
        ppVar8 = ppVar14;
        ppVar16 = (pair<int,_double> *)this;
        if (ppVar14 + -1 != (pair<int,_double> *)this) {
          dVar23 = floor(__x + 0.5);
          dVar20 = floor(__x);
          dVar21 = ceil(__x);
          ppVar12 = ppVar14 + -1;
          lVar13 = local_b0;
          do {
            iVar2 = ppVar12[-1].first;
            dVar22 = ppVar12[-1].second;
            dVar24 = *(double *)(lVar3 + lVar9 * 8);
            uVar18 = -(ulong)(0.0 < dVar24);
            uVar19 = -(ulong)(dVar24 < 0.0);
            dVar26 = (double)(uVar18 & (ulong)dVar21 |
                             ~uVar18 & (~uVar19 & (ulong)dVar23 | uVar19 & (ulong)dVar20));
            lVar4 = *(long *)((long)(end._M_current)->second + 0x308);
            lVar17 = *(long *)((long)(end._M_current)->second + 800);
            dVar24 = *(double *)(lVar17 + lVar9 * 8);
            if (dVar24 <= dVar26) {
              dVar26 = dVar24;
            }
            dVar24 = *(double *)(lVar4 + lVar9 * 8);
            if (dVar26 <= dVar24) {
              dVar26 = dVar24;
            }
            lVar15 = (long)iVar2;
            dVar24 = *(double *)(lVar3 + lVar15 * 8);
            if (dVar24 <= 0.0) {
              dVar25 = dVar22;
              if (0.0 <= dVar24) {
                dVar25 = dVar22 + 0.5;
              }
              dVar24 = floor(dVar25);
            }
            else {
              dVar24 = ceil(dVar22);
            }
            dVar25 = *(double *)(lVar17 + lVar15 * 8);
            if (dVar25 <= dVar24) {
              dVar24 = dVar25;
            }
            dVar25 = *(double *)(lVar4 + lVar15 * 8);
            if (dVar24 <= dVar25) {
              dVar24 = dVar25;
            }
            if ((ABS(dVar24 - dVar22) <= ABS(dVar26 - __x)) &&
               ((ABS(dVar24 - dVar22) < ABS(dVar26 - __x) ||
                ((((ulong)(uint)(iVar5 + iVar2) + 0x8a183895eeac1536) * lVar6 ^
                 ((ulong)(uint)(iVar5 + iVar2) + 0x80c8963be3e4c2f3) * lVar7 >> 0x20) <= uVar11))))
            {
              ppVar8 = ppVar12 + 1;
              ppVar16 = ppVar12;
              break;
            }
            ppVar12->first = iVar2;
            ppVar12->second = dVar22;
            lVar13 = lVar13 + 0x10;
            ppVar8 = ppVar12;
            ppVar12 = ppVar12 + -1;
          } while (lVar13 != 0);
        }
        ppVar16->first = iVar1;
        ppVar8[-1].second = __x;
        local_a8 = local_a8 + ((long)ppVar14 - (long)ppVar16 >> 4);
        if (8 < local_a8) {
          return false;
        }
      }
      local_b0 = local_b0 + -0x10;
      ppVar8 = ppVar14 + 1;
      ppVar16 = ppVar14;
    } while (ppVar14 + 1 != begin._M_current);
  }
  return true;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }